

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_UnknownExtendee_Test::TestBody
          (AllowUnknownDependenciesTest_UnknownExtendee_Test *this)

{
  Descriptor *pDVar1;
  ushort *puVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  FileDescriptor *pFVar5;
  Nonnull<const_char_*> pcVar6;
  Message *in_RCX;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar7;
  pointer pcVar8;
  char *in_R9;
  pointer *__ptr;
  string_view input;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  FileDescriptorProto extension_proto;
  AssertHelper local_150;
  undefined1 local_148 [8];
  LogMessageData *local_140;
  undefined1 local_138 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  AssertHelper local_118;
  FileDescriptorProto local_110;
  
  FileDescriptorProto::FileDescriptorProto(&local_110,(Arena *)0x0);
  input._M_str = (char *)&local_110;
  input._M_len = (size_t)
                 "name: \'extension.proto\'extension { extendee: \'UnknownType\' name:\'some_extension\' number:123            label:LABEL_OPTIONAL type:TYPE_INT32 }"
  ;
  bVar4 = TextFormat::ParseFromString((TextFormat *)0x8d,input,in_RCX);
  local_148[0] = (internal)bVar4;
  local_140 = (LogMessageData *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)local_148,
               (AssertionResult *)
               "TextFormat::ParseFromString( \"name: \'extension.proto\'\" \"extension { extendee: \'UnknownType\' name:\'some_extension\' number:123\" \"            label:LABEL_OPTIONAL type:TYPE_INT32 }\", &extension_proto)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xe7a,(char *)CONCAT71(local_138._1_7_,local_138[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_138._1_7_,local_138[0]) != &local_128) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_138._1_7_,local_138[0]),local_128._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) + 8))();
    }
    if (local_140 != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
    }
    if (!bVar4) goto LAB_0058e56f;
  }
  pFVar5 = AllowUnknownDependenciesTest::BuildFile
                     (&this->super_AllowUnknownDependenciesTest,&local_110);
  auVar3 = local_148;
  local_148[0] = (internal)(pFVar5 != (FileDescriptor *)0x0);
  local_140 = (LogMessageData *)0x0;
  if (pFVar5 == (FileDescriptor *)0x0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_140;
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)local_148,(AssertionResult *)0x10faf95,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xe7d,(char *)CONCAT71(local_138._1_7_,local_138[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_138._1_7_,local_138[0]) != &local_128) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_138._1_7_,local_138[0]),local_128._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) + 8))();
    }
    __ptr_00._M_head_impl = local_140;
    if (local_140 == (LogMessageData *)0x0) goto LAB_0058e56f;
  }
  else {
    local_148._4_4_ = auVar3._4_4_;
    local_148._0_4_ = 1;
    local_150.data_._0_4_ = pFVar5->extension_count_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_138,"1","file->extension_count()",(int *)local_148,
               (int *)&local_150);
    if (local_138[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_148);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_130._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar7 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar7 = *(char **)local_130._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xe7f,pcVar7);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)local_148);
    }
    else {
      if (local_130._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130._M_head_impl);
      }
      if ((long)pFVar5->extension_count_ < 1) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,(long)pFVar5->extension_count_,"index < extension_count()");
      }
      else {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar6 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_138,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xaec,pcVar6);
        goto LAB_0058e60d;
      }
      pDVar1 = pFVar5->extensions_->containing_type_;
      puVar2 = (ushort *)(pDVar1->all_names_).payload_;
      local_148._2_6_ = 0;
      local_148._0_2_ = *puVar2;
      local_140 = (LogMessageData *)((long)puVar2 + ~(ulong)local_148);
      testing::internal::CmpHelperEQ<char[12],std::basic_string_view<char,std::char_traits<char>>>
                ((internal *)local_138,"\"UnknownType\"","extendee->name()",(char (*) [12])0x11363d2
                 ,(basic_string_view<char,_std::char_traits<char>_> *)local_148);
      if (local_138[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_148);
        if (local_130._M_head_impl == (LogMessageData *)0x0) {
          pcVar7 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar7 = (char *)((local_130._M_head_impl)->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0xe81,pcVar7);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        if (local_148 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_148 + 8))();
        }
      }
      if (local_130._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130._M_head_impl);
      }
      local_148 = (undefined1  [8])
                  (CONCAT71(local_148._1_7_,pDVar1->field_0x1) & 0xffffffffffffff01);
      local_140 = (LogMessageData *)0x0;
      if ((pDVar1->field_0x1 & 1) == 0) {
        testing::Message::Message((Message *)&local_150);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_138,(internal *)local_148,
                   (AssertionResult *)"extendee->is_placeholder()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_118,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0xe82,(char *)CONCAT71(local_138._1_7_,local_138[0]));
        testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_138._1_7_,local_138[0]) != &local_128) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_138._1_7_,local_138[0]),
                          local_128._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) + 8))();
        }
      }
      if (local_140 != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
        ;
      }
      local_148._0_4_ = 1;
      local_150.data_._0_4_ = pDVar1->extension_range_count_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_138,"1","extendee->extension_range_count()",(int *)local_148,
                 (int *)&local_150);
      if (local_138[0] != (internal)0x0) {
        if (local_130._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130._M_head_impl);
        }
        local_150.data_._0_4_ = 1;
        if ((long)pDVar1->extension_range_count_ < 1) {
          pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (0,(long)pDVar1->extension_range_count_,
                              "index < extension_range_count()");
        }
        else {
          pcVar6 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar6 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa94,pcVar6);
LAB_0058e60d:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_138);
        }
        local_118.data_._0_4_ = pDVar1->extension_ranges_->start_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_148,"1","extendee->extension_range(0)->start_number()",
                   (int *)&local_150,(int *)&local_118);
        if (local_148[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_138);
          if (local_140 == (LogMessageData *)0x0) {
            pcVar8 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar8 = (pointer)(local_140->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0xe84,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
          }
        }
        if (local_140 != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140);
        }
        local_150.data_._0_4_ = 0x20000000;
        if ((long)pDVar1->extension_range_count_ < 1) {
          pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (0,(long)pDVar1->extension_range_count_,
                              "index < extension_range_count()");
        }
        else {
          pcVar6 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar6 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa94,pcVar6);
          goto LAB_0058e60d;
        }
        local_118.data_._0_4_ = pDVar1->extension_ranges_->end_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_148,"FieldDescriptor::kMaxNumber + 1",
                   "extendee->extension_range(0)->end_number()",(int *)&local_150,(int *)&local_118)
        ;
        if (local_148[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_138);
          if (local_140 == (LogMessageData *)0x0) {
            pcVar8 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar8 = (pointer)(local_140->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0xe86,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
          }
        }
        if (local_140 == (LogMessageData *)0x0) goto LAB_0058e56f;
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_140;
        __ptr_00._M_head_impl = local_140;
        goto LAB_0058e56a;
      }
      testing::Message::Message((Message *)local_148);
      if (local_130._M_head_impl == (LogMessageData *)0x0) {
        pcVar8 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar8 = (pointer)((local_130._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xe83,pcVar8);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)local_148);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_148 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_148 + 8))();
    }
    if (local_130._M_head_impl == (LogMessageData *)0x0) goto LAB_0058e56f;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_130;
    __ptr_00._M_head_impl = local_130._M_head_impl;
  }
LAB_0058e56a:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00._M_head_impl);
LAB_0058e56f:
  FileDescriptorProto::~FileDescriptorProto(&local_110);
  return;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, UnknownExtendee) {
  // Test that we can extend an unknown type.  This is slightly tricky because
  // it means that the placeholder type must have an extension range.

  FileDescriptorProto extension_proto;

  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: 'extension.proto'"
      "extension { extendee: 'UnknownType' name:'some_extension' number:123"
      "            label:LABEL_OPTIONAL type:TYPE_INT32 }",
      &extension_proto));
  const FileDescriptor* file = BuildFile(extension_proto);

  ASSERT_TRUE(file != nullptr);

  ASSERT_EQ(1, file->extension_count());
  const Descriptor* extendee = file->extension(0)->containing_type();
  EXPECT_EQ("UnknownType", extendee->name());
  EXPECT_TRUE(extendee->is_placeholder());
  ASSERT_EQ(1, extendee->extension_range_count());
  EXPECT_EQ(1, extendee->extension_range(0)->start_number());
  EXPECT_EQ(FieldDescriptor::kMaxNumber + 1,
            extendee->extension_range(0)->end_number());
}